

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O0

int mixed_compute_gains(float *position,float *gains,mixed_channel_t *speakers,
                       mixed_channel_t *count,vbap_data *data)

{
  mixed_channel_t mVar1;
  int local_6c;
  char local_65;
  int i_1;
  char okey;
  int j;
  char cur_negs;
  undefined8 uStack_58;
  float cur_gain;
  float gain [3];
  int i;
  float direction [3];
  mixed_channel_t best_set;
  char best_negs;
  float best_gain;
  char dims;
  vbap_data *data_local;
  mixed_channel_t *count_local;
  mixed_channel_t *speakers_local;
  float *gains_local;
  float *position_local;
  
  mVar1 = data->dims;
  direction[2] = -INFINITY;
  direction[1]._2_1_ = 0;
  vec_normalize(gain + 2,position);
  if (((((gain[2] == 0.0) && (!NAN(gain[2]))) && ((float)i == 0.0)) &&
      ((!NAN((float)i) && (direction[0] == 0.0)))) && (!NAN(direction[0]))) {
    if (mVar1 == '\x03') {
      i = -0x40800000;
    }
    else {
      direction[0] = 1.0;
    }
  }
  direction[1]._3_1_ = mVar1;
  for (gain[1] = 0.0; (int)gain[1] < data->set_count; gain[1] = (float)((int)gain[1] + 1)) {
    memset(&stack0xffffffffffffffa8,0,0xc);
    j = 0x7f800000;
    okey = mVar1;
    for (i_1 = 0; i_1 < (char)mVar1; i_1 = i_1 + 1) {
      direction[(long)i_1 + -6] =
           direction[0] * data->sets[(int)gain[1]].inv_mat[i_1 * 3 + 2] +
           gain[2] * data->sets[(int)gain[1]].inv_mat[i_1 * 3] +
           (float)i * data->sets[(int)gain[1]].inv_mat[i_1 * 3 + 1];
      if (direction[(long)i_1 + -6] < (float)j) {
        j = (int)direction[(long)i_1 + -6];
      }
      if (-0.01 <= direction[(long)i_1 + -6]) {
        okey = okey + -1;
      }
    }
    if ((direction[2] < (float)j) && (okey <= (char)direction[1]._3_1_)) {
      direction[2] = (float)j;
      direction[1]._3_1_ = okey;
      direction[1]._2_1_ = SUB41(gain[1],0);
      *(undefined8 *)gains = uStack_58;
      gains[2] = gain[0];
    }
  }
  *(undefined2 *)speakers = *(undefined2 *)data->sets[direction[1]._2_1_].speakers;
  speakers[2] = data->sets[direction[1]._2_1_].speakers[2];
  local_65 = '\x01';
  for (local_6c = 0; local_6c < (char)mVar1; local_6c = local_6c + 1) {
    if (gains[local_6c] < -0.01) {
      gains[local_6c] = 0.0001;
      local_65 = '\0';
    }
  }
  vec_normalize(gains,gains);
  *count = mVar1;
  return (int)local_65;
}

Assistant:

VECTORIZE int mixed_compute_gains(const float position[3], float gains[], mixed_channel_t speakers[], mixed_channel_t *count, struct vbap_data *data){
  char dims = data->dims;
  float best_gain = -INFINITY;
  char best_negs = dims;
  mixed_channel_t best_set = 0;
  
  // If the direction is a zero vector, recast as 0,-1,0 on 3d, and 0,0,1 on 2d.
  // which should give a best approximation for being "on" the position.
  // Ideally we'd drive *all* speakers in that case, but the exact power of them
  // isn't clear to me.
  float direction[3];
  vec_normalize(direction, position);
  if(direction[0] == 0.0 && direction[1] == 0.0 && direction[2] == 0.0){
    if(dims == 3) direction[1] = -1.0;
    else          direction[2] = +1.0;
  }
  // Find set with the highest correspondence to our direction
  for(int i=0; i<data->set_count; ++i){
    float gain[3] = {0.0, 0.0, 0.0};
    float cur_gain = INFINITY;
    char cur_negs = dims;
    
    for(int j=0; j<dims; ++j){
      gain[j] = direction[0] * data->sets[i].inv_mat[0+j*3] +
                direction[1] * data->sets[i].inv_mat[1+j*3] +
                direction[2] * data->sets[i].inv_mat[2+j*3];
      if(gain[j] < cur_gain)
        cur_gain = gain[j];
      if(-0.01 <= gain[j])
        cur_negs--;
    }
    if(best_gain < cur_gain && cur_negs <= best_negs){
      best_gain = cur_gain;
      best_negs = cur_negs;
      best_set = i;
      memcpy(gains, gain, sizeof(float)*3);
    }
  }
  memcpy(speakers, data->sets[best_set].speakers, sizeof(mixed_channel_t)*3);
  // Handle if the best set still does not contain our point.
  char okey = 1;
  for(int i=0; i<dims; ++i){
    if(gains[i] < -0.01){
      gains[i] = 0.0001;
      okey = 0;
    }
  }
  vec_normalize(gains, gains);
  *count = dims;
  return okey;
}